

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

size_t WriteDataToDisk(FILE *file,char *buf,size_t len)

{
  size_t sVar1;
  ostream *poVar2;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (file == (FILE *)0x0) {
    local_54.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_50,"WriteDataToDisk",&local_56);
    poVar2 = Logger::Start(ERR,&local_30,0xc2,&local_50);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc2);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"file");
    std::operator<<(poVar2," == NULL \n");
  }
  else if (buf == (char *)0x0) {
    local_54.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_50,"WriteDataToDisk",&local_56);
    poVar2 = Logger::Start(ERR,&local_30,0xc3,&local_50);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"buf");
    std::operator<<(poVar2," == NULL \n");
  }
  else {
    if (len != 0) {
      sVar1 = fwrite(buf,1,len,(FILE *)file);
      if (sVar1 != len) {
        local_54.severity_ = FATAL;
        std::__cxx11::string::string
                  ((string *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                   ,&local_55);
        std::__cxx11::string::string((string *)&local_50,"WriteDataToDisk",&local_56);
        poVar2 = Logger::Start(FATAL,&local_30,199,&local_50);
        std::operator<<(poVar2,"Error: invoke fwrite().");
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_30);
        Logger::~Logger(&local_54);
      }
      return sVar1;
    }
    local_54.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_50,"WriteDataToDisk",&local_56);
    poVar2 = Logger::Start(ERR,&local_30,0xc4,&local_50);
    poVar2 = std::operator<<(poVar2,"CHECK_GT failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc4);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"len");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"0");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

inline size_t WriteDataToDisk(FILE *file, const char *buf, size_t len) {
  CHECK_NOTNULL(file);
  CHECK_NOTNULL(buf);
  CHECK_GT(len, 0);
  size_t write_len = fwrite(buf, 1, len, file);
  if (write_len != len) {
    LOG(FATAL) << "Error: invoke fwrite().";
  }
  return write_len;
}